

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OddImageSizes.c
# Opt level: O0

void draw(IceTDouble *projection_matrix,IceTDouble *modelview_matrix,IceTFloat *background_color,
         IceTInt *readback_viewport,IceTImage result)

{
  double dVar1;
  float *pfVar2;
  undefined1 *puVar3;
  long lVar4;
  IceTInt *pIVar5;
  undefined8 *puVar6;
  byte bVar7;
  double dVar8;
  hexahedron in_stack_fffffffffffffc38;
  int local_304;
  IceTFloat *depth_dest;
  IceTUByte *color_dest_1;
  IceTFloat *color_dest;
  IceTDouble opacity;
  IceTDouble thickness;
  IceTDouble shading;
  IceTDouble *near_plane;
  float local_2a8;
  IceTFloat depth;
  IceTFloat color [4];
  IceTBoolean local_28d;
  int local_28c;
  IceTBoolean intersection_happened;
  double dStack_288;
  IceTInt near_plane_index;
  IceTDouble far_distance;
  IceTDouble near_distance;
  IceTDouble *transformed_plane;
  IceTDouble *original_plane;
  IceTDouble ray_direction [3];
  double local_248;
  IceTDouble ray_origin [3];
  int local_228;
  int local_224;
  IceTInt pixel_y;
  IceTInt pixel_x;
  IceTFloat *depths;
  IceTUByte *colors_byte;
  IceTFloat *colors_float;
  IceTInt screen_height;
  IceTInt screen_width;
  hexahedron transformed_box;
  int planeIdx;
  IceTBoolean success;
  IceTDouble inverse_transpose_transform [16];
  IceTDouble transform [16];
  IceTInt *readback_viewport_local;
  IceTFloat *background_color_local;
  IceTDouble *modelview_matrix_local;
  IceTDouble *projection_matrix_local;
  IceTImage result_local;
  
  bVar7 = 0;
  colors_byte = (IceTUByte *)0x0;
  depths = (IceTFloat *)0x0;
  _pixel_y = (IceTFloat *)0x0;
  icetMatrixMultiply(inverse_transpose_transform + 0xf,projection_matrix,modelview_matrix);
  transformed_box.planes[5][3]._7_1_ =
       icetMatrixInverseTranspose(inverse_transpose_transform + 0xf,(IceTDouble *)&planeIdx);
  if (transformed_box.planes[5][3]._7_1_ == '\0') {
    printf("ERROR: Inverse failed.\n");
  }
  for (transformed_box.planes[5][3]._0_4_ = 0; transformed_box.planes[5][3]._0_4_ < 6;
      transformed_box.planes[5][3]._0_4_ = transformed_box.planes[5][3]._0_4_ + 1) {
    transformed_plane = unit_box.planes[transformed_box.planes[5][3]._0_4_];
    near_distance = (IceTDouble)(&screen_height + (long)transformed_box.planes[5][3]._0_4_ * 8);
    icetMatrixVectorMultiply((IceTDouble *)near_distance,(IceTDouble *)&planeIdx,transformed_plane);
  }
  icetGetIntegerv(7,(IceTInt *)((long)&colors_float + 4));
  icetGetIntegerv(8,(IceTInt *)&colors_float);
  if (g_transparent == '\0') {
    depths = (IceTFloat *)icetImageGetColorub(result);
    _pixel_y = icetImageGetDepthf(result);
  }
  else {
    colors_byte = (IceTUByte *)icetImageGetColorf(result);
  }
  ray_direction[0] = 0.0;
  original_plane = (IceTDouble *)0x0;
  ray_direction[1] = 1.0;
  ray_origin[1] = -1.0;
  for (local_228 = readback_viewport[1]; local_228 < readback_viewport[1] + readback_viewport[3];
      local_228 = local_228 + 1) {
    ray_origin[0] = (IceTDouble)(((double)local_228 * 2.0) / (double)(int)colors_float - 1.0);
    for (local_224 = *readback_viewport; local_224 < *readback_viewport + readback_viewport[2];
        local_224 = local_224 + 1) {
      local_248 = ((double)local_224 * 2.0) / (double)colors_float._4_4_ - 1.0;
      pIVar5 = &screen_height;
      puVar6 = (undefined8 *)&stack0xfffffffffffffc38;
      for (lVar4 = 0x18; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar6 = *(undefined8 *)pIVar5;
        pIVar5 = pIVar5 + (ulong)bVar7 * -4 + 2;
        puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
      }
      intersect_ray_hexahedron
                ((IceTDouble *)&local_248,(IceTDouble *)&original_plane,in_stack_fffffffffffffc38,
                 &far_distance,(IceTDouble *)&stack0xfffffffffffffd78,&local_28c,&local_28d);
      if (local_28d == '\0') {
        local_2a8 = (float)*background_color;
        depth = background_color[1];
        color[0] = background_color[2];
        color[1] = background_color[3];
        near_plane._4_4_ = 1.0;
      }
      else {
        lVar4 = (long)local_28c;
        dVar1 = (double)transformed_box.planes[lVar4][1];
        dVar8 = sqrt((double)transformed_box.planes[lVar4][1] *
                     (double)transformed_box.planes[lVar4][1] +
                     *(double *)(&screen_height + lVar4 * 8) *
                     *(double *)(&screen_height + lVar4 * 8) +
                     (double)transformed_box.planes[lVar4][0] *
                     (double)transformed_box.planes[lVar4][0]);
        dVar8 = -dVar1 / dVar8;
        local_2a8 = g_color[0] * (float)dVar8;
        depth = (IceTFloat)(g_color[1] * (float)dVar8);
        color[0] = (IceTFloat)(g_color[2] * (float)dVar8);
        color[1] = (IceTFloat)g_color[3];
        near_plane._4_4_ = (float)((double)far_distance * 0.5);
        if (g_transparent != '\0') {
          if (4.0 <= (dStack_288 - (double)far_distance) * 4.0) {
            local_304 = 0x1000;
          }
          else {
            local_304 = (int)((dStack_288 - (double)far_distance) * 4.0 * 1024.0);
          }
          dVar1 = (double)g_opacity_lookup[local_304];
          local_2a8 = (float)dVar1 * local_2a8;
          depth = (IceTFloat)((float)dVar1 * (float)depth);
          color[0] = (IceTFloat)((float)dVar1 * (float)color[0]);
          color[1] = (IceTFloat)((float)dVar1 * g_color[3]);
        }
      }
      if (g_transparent == '\0') {
        puVar3 = (undefined1 *)
                 ((long)depths + (long)((local_228 * colors_float._4_4_ + local_224) * 4));
        *puVar3 = (char)(int)(local_2a8 * 255.0);
        puVar3[1] = (char)(int)((float)depth * 255.0);
        puVar3[2] = (char)(int)((float)color[0] * 255.0);
        puVar3[3] = (char)(int)((float)color[1] * 255.0);
        _pixel_y[(long)(local_228 * colors_float._4_4_) + (long)local_224] =
             (IceTFloat)near_plane._4_4_;
      }
      else {
        pfVar2 = (float *)(colors_byte +
                          (long)((local_228 * colors_float._4_4_ + local_224) * 4) * 4);
        *pfVar2 = local_2a8;
        pfVar2[1] = (float)depth;
        pfVar2[2] = (float)color[0];
        pfVar2[3] = (float)color[1];
      }
    }
  }
  if (g_first_render != '\0') {
    if (g_sync_render != '\0') {
      icetCommBarrier();
    }
    g_first_render = '\0';
  }
  return;
}

Assistant:

static void draw(const IceTDouble *projection_matrix,
                 const IceTDouble *modelview_matrix,
                 const IceTFloat *background_color,
                 const IceTInt *readback_viewport,
                 IceTImage result)
{
    IceTUByte *color_buffer;
    IceTFloat *depth_buffer;
    IceTSizeType num_pixels;
    IceTSizeType i;

    /* Suppress compiler warnings. */
    (void)projection_matrix;
    (void)modelview_matrix;
    (void)background_color;
    (void)readback_viewport;

    num_pixels = icetImageGetNumPixels(result);

    color_buffer = icetImageGetColorub(result);
    for (i = 0; i < num_pixels*4; i++) {
        color_buffer[i] = 255;
    }

    depth_buffer = icetImageGetDepthf(result);
    for (i = 0; i < num_pixels; i++) {
        depth_buffer[i] = 0.5f;
    }
}